

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_export_ostream.cpp
# Opt level: O3

void __thiscall
gtest_suite_UnsignedToString_::Zero<unsigned_char>::TestBody(Zero<unsigned_char> *this)

{
  not_null<std::array<char,_3UL>_*> nVar1;
  char *pcVar2;
  base10storage<TypeParam> out;
  AssertHelper AStack_58;
  internal local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  array<char,_3UL> local_1b;
  not_null<std::array<char,_3UL>_*> local_18;
  
  local_18.ptr_ = &local_1b;
  pstore::gsl::not_null<std::array<char,_3UL>_*>::ensure_invariant(&local_18);
  nVar1.ptr_ = local_18.ptr_;
  pcVar2 = (local_18.ptr_)->_M_elems;
  (local_18.ptr_)->_M_elems[2] = '0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,pcVar2 + 2,nVar1.ptr_ + 1);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[2]>
            (local_50,"(std::string{x.first, x.second})","\"0\"",&local_40,(char (*) [2])0x1e9f1b);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_export_ostream.cpp"
               ,0x2a,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&AStack_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_40._M_dataplus._M_p + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  return;
}

Assistant:

TYPED_TEST_P (UnsignedToString, Zero) {
    using namespace pstore::exchange::export_ns::details;
    base10storage<TypeParam> out;
    std::pair<char const *, char const *> const x = to_characters (TypeParam{0}, &out);
    EXPECT_EQ ((std::string{x.first, x.second}), "0");
}